

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  ImFont *pIVar6;
  ulong uVar7;
  uchar *puVar8;
  ushort uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ushort *puVar14;
  ushort *puVar15;
  uchar *puVar16;
  uint uVar17;
  undefined7 local_148;
  uint uStack_141;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  ImWchar *pIStack_120;
  float local_118;
  char local_108 [48];
  undefined2 local_d8;
  ImFontConfig local_d0;
  float local_48;
  
  uVar3 = *(uint *)((long)compressed_ttf_data + 8);
  uVar17 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  local_48 = size_pixels;
  puVar5 = (uchar *)ImGui::MemAlloc((ulong)uVar17);
  uVar3 = *compressed_ttf_data;
  if (((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) ==
       0x57bc0000) &&
     (uVar3 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar3 >> 0x18 == 0 && (uVar3 & 0xff0000) == 0) && (uVar3 & 0xff00) == 0) &&
     (uVar3 & 0xff) == 0)) {
    uVar3 = *(uint *)((long)compressed_ttf_data + 8);
    puVar8 = puVar5;
    puVar14 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e =
         puVar5 + (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18);
    stb__barrier_out_b = puVar5;
    stb__dout = puVar5;
    do {
      bVar1 = (byte)*puVar14;
      uVar10 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                uVar9 = puVar14[2] << 8 | puVar14[2] >> 8;
                stb__dout = puVar8 + (ulong)uVar9 + 1;
                if (stb__dout <= stb__barrier_out_e) {
                  bVar1 = *(byte *)((long)puVar14 + 1);
                  uVar7 = (ulong)(byte)puVar14[1] * 0x100;
                  bVar2 = *(byte *)((long)puVar14 + 3);
                  if (puVar8 + ~((ulong)bVar1 * 0x10000 + (ulong)bVar2 | uVar7) < stb__barrier_out_b
                     ) {
                    stb__dout = stb__barrier_out_e + 1;
                  }
                  else {
                    iVar11 = uVar9 + 1;
                    do {
                      stb__dout = puVar8 + 1;
                      *puVar8 = puVar8[~(bVar2 + uVar7) + (ulong)bVar1 * -0x10000];
                      iVar11 = iVar11 + -1;
                      puVar8 = stb__dout;
                    } while (iVar11 != 0);
                  }
                }
                puVar15 = puVar14 + 3;
                puVar8 = stb__dout;
              }
              else {
                if (uVar10 != 6) {
                  if (uVar10 == 7) {
                    stb__lit((byte *)((long)puVar14 + 3),
                             (ushort)(*(ushort *)((long)puVar14 + 1) << 8 |
                                     *(ushort *)((long)puVar14 + 1) >> 8) + 1);
                    uVar7 = (ulong)(ushort)(*(ushort *)((long)puVar14 + 1) << 8 |
                                           *(ushort *)((long)puVar14 + 1) >> 8);
                    lVar12 = 4;
                    goto LAB_00202cfe;
                  }
                  break;
                }
                stb__dout = puVar8 + (ulong)(byte)puVar14[2] + 1;
                if (stb__dout <= stb__barrier_out_e) {
                  bVar1 = *(byte *)((long)puVar14 + 1);
                  uVar7 = (ulong)(byte)puVar14[1] * 0x100;
                  bVar2 = *(byte *)((long)puVar14 + 3);
                  if (puVar8 + ~((ulong)bVar1 * 0x10000 + (ulong)bVar2 | uVar7) < stb__barrier_out_b
                     ) {
                    stb__dout = stb__barrier_out_e + 1;
                  }
                  else {
                    uVar13 = (ulong)(byte)puVar14[2] + 1;
                    do {
                      stb__dout = puVar8 + 1;
                      *puVar8 = puVar8[~(bVar2 + uVar7) + (ulong)bVar1 * -0x10000];
                      uVar10 = (int)uVar13 - 1;
                      uVar13 = (ulong)uVar10;
                      puVar8 = stb__dout;
                    } while (uVar10 != 0);
                  }
                }
                puVar15 = (ushort *)((long)puVar14 + 5);
                puVar8 = stb__dout;
              }
            }
            else {
              stb__lit((uchar *)(puVar14 + 1),
                       ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar14 + 1)) - 0x7ff);
              uVar7 = (ulong)(ushort)(*puVar14 << 8 | *puVar14 >> 8);
              lVar12 = -0x7fd;
LAB_00202cfe:
              puVar15 = (ushort *)((long)puVar14 + uVar7 + lVar12);
              puVar8 = stb__dout;
              if (puVar15 == puVar14) break;
            }
          }
          else {
            uVar9 = *(ushort *)((long)puVar14 + 3) << 8 | *(ushort *)((long)puVar14 + 3) >> 8;
            stb__dout = puVar8 + (ulong)uVar9 + 1;
            if (stb__dout <= stb__barrier_out_e) {
              uVar7 = (ulong)(((uint)*(byte *)((long)puVar14 + 1) * 0x100 +
                              ((uint)(byte)puVar14[1] | (uint)bVar1 << 0x10)) - 0xfffff);
              if (puVar8 + -uVar7 < stb__barrier_out_b) {
                stb__dout = stb__barrier_out_e + 1;
              }
              else {
                iVar11 = uVar9 + 1;
                do {
                  stb__dout = puVar8 + 1;
                  *puVar8 = puVar8[-uVar7];
                  iVar11 = iVar11 + -1;
                  puVar8 = stb__dout;
                } while (iVar11 != 0);
              }
            }
            puVar15 = (ushort *)((long)puVar14 + 5);
            puVar8 = stb__dout;
          }
        }
        else {
          stb__dout = puVar8 + (ulong)*(byte *)((long)puVar14 + 3) + 1;
          if (stb__dout <= stb__barrier_out_e) {
            uVar7 = (ulong)(((uint)*(byte *)((long)puVar14 + 1) * 0x100 +
                            ((uint)(byte)puVar14[1] | (uint)bVar1 << 0x10)) - 0x17ffff);
            if (puVar8 + -uVar7 < stb__barrier_out_b) {
              stb__dout = stb__barrier_out_e + 1;
            }
            else {
              uVar13 = (ulong)*(byte *)((long)puVar14 + 3) + 1;
              do {
                stb__dout = puVar8 + 1;
                *puVar8 = puVar8[-uVar7];
                uVar10 = (int)uVar13 - 1;
                uVar13 = (ulong)uVar10;
                puVar8 = stb__dout;
              } while (uVar10 != 0);
            }
          }
          puVar15 = puVar14 + 2;
          puVar8 = stb__dout;
        }
      }
      else if ((char)bVar1 < '\0') {
        uVar10 = uVar10 - 0x7f;
        uVar7 = (ulong)uVar10;
        puVar16 = puVar8 + uVar7;
        puVar4 = puVar16;
        if (puVar16 <= stb__barrier_out_e) {
          bVar1 = *(byte *)((long)puVar14 + 1);
          puVar16 = puVar8;
          if (puVar8 + ~(ulong)bVar1 < stb__barrier_out_b) {
            puVar16 = stb__barrier_out_e + 1;
            puVar4 = puVar16;
          }
          else {
            while (puVar4 = stb__dout, uVar10 != 0) {
              stb__dout = puVar16 + 1;
              *puVar16 = puVar16[~(ulong)bVar1];
              uVar10 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar10;
              puVar16 = stb__dout;
            }
          }
        }
        stb__dout = puVar4;
        puVar15 = puVar14 + 1;
        puVar8 = puVar16;
      }
      else {
        if (bVar1 < 0x40) {
          stb__lit((byte *)((long)puVar14 + 1),uVar10 - 0x1f);
          uVar7 = (ulong)(byte)*puVar14;
          lVar12 = -0x1e;
          goto LAB_00202cfe;
        }
        stb__dout = puVar8 + (ulong)(byte)puVar14[1] + 1;
        if (stb__dout <= stb__barrier_out_e) {
          uVar7 = (ulong)(((uint)*(byte *)((long)puVar14 + 1) + (uint)bVar1 * 0x100) - 0x3fff);
          if (puVar8 + -uVar7 < stb__barrier_out_b) {
            stb__dout = stb__barrier_out_e + 1;
          }
          else {
            uVar13 = (ulong)(byte)puVar14[1] + 1;
            do {
              stb__dout = puVar8 + 1;
              *puVar8 = puVar8[-uVar7];
              uVar10 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar10;
              puVar8 = stb__dout;
            } while (uVar10 != 0);
          }
        }
        puVar15 = (ushort *)((long)puVar14 + 3);
        puVar8 = stb__dout;
      }
      puVar14 = puVar15;
    } while (puVar8 <= puVar5 + (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                uVar3 << 0x18));
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_d0.MergeMode = false;
    local_d0._73_3_ = 0;
    local_d0.FontBuilderFlags = 0;
    local_148._0_3_ = 0;
    local_148._3_4_ = 0;
    uStack_141 = 0;
    local_138._0_1_ = false;
    local_138._1_3_ = 0;
    local_138._4_4_ = 0.0;
    uStack_130._0_4_ = 0.0;
    uStack_130._4_4_ = 0.0;
    local_128._0_4_ = 0.0;
    local_128._4_4_ = 0;
    pIStack_120 = (ImWchar *)0x0;
    local_118 = 0.0;
    local_108[0] = '\0';
    local_108[1] = '\0';
    local_108[2] = '\0';
    local_108[3] = '\0';
    local_108[4] = '\0';
    local_108[5] = '\0';
    local_108[6] = '\0';
    local_108[7] = '\0';
    local_108[8] = '\0';
    local_108[9] = '\0';
    local_108[10] = '\0';
    local_108[0xb] = '\0';
    local_108[0xc] = '\0';
    local_108[0xd] = '\0';
    local_108[0xe] = '\0';
    local_108[0xf] = '\0';
    local_108[0x10] = '\0';
    local_108[0x11] = '\0';
    local_108[0x12] = '\0';
    local_108[0x13] = '\0';
    local_108[0x14] = '\0';
    local_108[0x15] = '\0';
    local_108[0x16] = '\0';
    local_108[0x17] = '\0';
    local_108[0x18] = '\0';
    local_108[0x19] = '\0';
    local_108[0x1a] = '\0';
    local_108[0x1b] = '\0';
    local_108[0x1c] = '\0';
    local_108[0x1d] = '\0';
    local_108[0x1e] = '\0';
    local_108[0x1f] = '\0';
    local_108[0x20] = '\0';
    local_108[0x21] = '\0';
    local_108[0x22] = '\0';
    local_108[0x23] = '\0';
    local_108[0x24] = '\0';
    local_108[0x25] = '\0';
    local_108[0x26] = '\0';
    local_108[0x27] = '\0';
    local_108._40_8_ = 0;
    local_d8 = 0;
    local_d0.OversampleH = 3;
    local_d0.OversampleV = 1;
    local_d0.EllipsisChar = 0xffff;
    local_d0.RasterizerMultiply = 1.0;
    local_d0.GlyphMaxAdvanceX = 3.4028235e+38;
  }
  else {
    local_148 = (undefined7)*(undefined8 *)&font_cfg_template->field_0xd;
    uStack_141._1_3_ = (undefined3)((uint)font_cfg_template->SizePixels >> 8);
    uStack_141._0_1_ = (undefined1)((ulong)*(undefined8 *)&font_cfg_template->field_0xd >> 0x38);
    local_d0.OversampleH = font_cfg_template->OversampleH;
    local_d0.OversampleV = font_cfg_template->OversampleV;
    local_138._0_1_ = font_cfg_template->PixelSnapH;
    local_138._1_3_ = *(undefined3 *)&font_cfg_template->field_0x21;
    local_138._4_4_ = (font_cfg_template->GlyphExtraSpacing).x;
    uStack_130 = *(undefined8 *)&(font_cfg_template->GlyphExtraSpacing).y;
    local_128 = *(undefined8 *)&(font_cfg_template->GlyphOffset).y;
    pIStack_120 = font_cfg_template->GlyphRanges;
    local_118 = font_cfg_template->GlyphMinAdvanceX;
    local_d0.GlyphMaxAdvanceX = font_cfg_template->GlyphMaxAdvanceX;
    local_d0.MergeMode = font_cfg_template->MergeMode;
    local_d0._73_3_ = *(undefined3 *)&font_cfg_template->field_0x49;
    local_d0.FontBuilderFlags = font_cfg_template->FontBuilderFlags;
    local_d0.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    local_d0.EllipsisChar = font_cfg_template->EllipsisChar;
    local_d8 = *(undefined2 *)((long)&font_cfg_template->DstFont + 6);
    local_108._32_8_ = *(undefined8 *)(font_cfg_template->Name + 0x20);
    local_108._40_8_ = *(undefined8 *)&font_cfg_template->field_0x7e;
    local_108._16_8_ = *(undefined8 *)(font_cfg_template->Name + 0x10);
    local_108._24_8_ = *(undefined8 *)(font_cfg_template->Name + 0x18);
    local_108._0_8_ = *(undefined8 *)font_cfg_template->Name;
    local_108._8_8_ = *(undefined8 *)(font_cfg_template->Name + 8);
  }
  local_d0.FontDataOwnedByAtlas = true;
  local_d0._13_3_ = (undefined3)local_148;
  local_d0.FontNo = local_148._3_4_;
  local_d0.PixelSnapH = local_138._0_1_;
  local_d0._33_3_ = local_138._1_3_;
  local_d0.GlyphExtraSpacing.x = local_138._4_4_;
  local_d0.GlyphExtraSpacing.y = (float)uStack_130;
  local_d0.GlyphOffset.x = uStack_130._4_4_;
  local_d0.GlyphOffset.y = (float)local_128;
  local_d0._52_4_ = local_128._4_4_;
  local_d0.GlyphRanges = pIStack_120;
  local_d0.GlyphMinAdvanceX = local_118;
  local_d0.Name[0] = local_108[0];
  local_d0.Name[1] = local_108[1];
  local_d0.Name[2] = local_108[2];
  local_d0.Name[3] = local_108[3];
  local_d0.Name[4] = local_108[4];
  local_d0.Name[5] = local_108[5];
  local_d0.Name[6] = local_108[6];
  local_d0.Name[7] = local_108[7];
  local_d0.Name[8] = local_108[8];
  local_d0.Name[9] = local_108[9];
  local_d0.Name[10] = local_108[10];
  local_d0.Name[0xb] = local_108[0xb];
  local_d0.Name[0xc] = local_108[0xc];
  local_d0.Name[0xd] = local_108[0xd];
  local_d0.Name[0xe] = local_108[0xe];
  local_d0.Name[0xf] = local_108[0xf];
  local_d0.Name[0x10] = local_108[0x10];
  local_d0.Name[0x11] = local_108[0x11];
  local_d0.Name[0x12] = local_108[0x12];
  local_d0.Name[0x13] = local_108[0x13];
  local_d0.Name[0x14] = local_108[0x14];
  local_d0.Name[0x15] = local_108[0x15];
  local_d0.Name[0x16] = local_108[0x16];
  local_d0.Name[0x17] = local_108[0x17];
  local_d0.Name[0x18] = local_108[0x18];
  local_d0.Name[0x19] = local_108[0x19];
  local_d0.Name[0x1a] = local_108[0x1a];
  local_d0.Name[0x1b] = local_108[0x1b];
  local_d0.Name[0x1c] = local_108[0x1c];
  local_d0.Name[0x1d] = local_108[0x1d];
  local_d0.Name[0x1e] = local_108[0x1e];
  local_d0.Name[0x1f] = local_108[0x1f];
  local_d0.Name[0x20] = local_108[0x20];
  local_d0.Name[0x21] = local_108[0x21];
  local_d0.Name[0x22] = local_108[0x22];
  local_d0.Name[0x23] = local_108[0x23];
  local_d0.Name[0x24] = local_108[0x24];
  local_d0.Name[0x25] = local_108[0x25];
  local_d0.Name[0x26] = local_108[0x26];
  local_d0.Name[0x27] = local_108[0x27];
  local_d0._126_8_ = local_108._40_8_;
  local_d0.DstFont._6_2_ = local_d8;
  local_d0.SizePixels =
       (float)(~-(uint)(0.0 < local_48) & uStack_141 | (uint)local_48 & -(uint)(0.0 < local_48));
  if (glyph_ranges != (ImWchar *)0x0) {
    local_d0.GlyphRanges = glyph_ranges;
  }
  local_d0.FontData = puVar5;
  local_d0.FontDataSize = uVar17;
  pIVar6 = AddFont(this,&local_d0);
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}